

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O1

size_t __thiscall
duckdb_zstd::ZSTD_compressBegin_usingCDict_internal
          (duckdb_zstd *this,ZSTD_CCtx *cctx,ZSTD_CDict *cdict,ZSTD_frameParameters fParams,
          unsigned_long_long pledgedSrcSize)

{
  int compressionLevel;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  uint uVar4;
  uint uVar5;
  size_t sVar7;
  ulong srcSizeHint;
  undefined1 auStack_128 [36];
  int local_104;
  ZSTD_CCtx_params cctxParams;
  ulong uVar6;
  
  srcSizeHint = CONCAT44((int)((ulong)register0x00000080 >> 0x20),fParams.noDictIDFlag);
  if (cctx != (ZSTD_CCtx *)0x0) {
    local_104 = fParams.contentSizeFlag;
    auStack_128._28_8_ = cdict;
    if ((((srcSizeHint < 0x20000) || (srcSizeHint == 0xffffffffffffffff)) ||
        (srcSizeHint < *(size_t *)&cctx->bmi2 * 6)) ||
       (compressionLevel = *(int *)((long)&cctx[1].xxhState.v4 + 4), compressionLevel == 0)) {
      cctxParams.format = (cctx->appliedParams).outBufferMode;
      cctxParams.cParams.windowLog = (cctx->appliedParams).blockDelimiters;
      uVar1 = (cctx->appliedParams).validateSequences;
      uVar2 = (cctx->appliedParams).useBlockSplitter;
      uVar3 = (cctx->appliedParams).useRowMatchFinder;
      cctxParams.cParams._16_8_ = *(undefined8 *)&(cctx->appliedParams).deterministicRefPrefix;
      cctxParams.cParams.chainLog = uVar1;
      cctxParams.cParams.hashLog = uVar2;
      cctxParams.cParams.searchLog = uVar3;
    }
    else {
      ZSTD_getCParams_internal
                ((ZSTD_compressionParameters *)&cctxParams,compressionLevel,srcSizeHint,
                 *(size_t *)&cctx->bmi2,ZSTD_cpm_unknown);
    }
    auStack_128._16_4_ = cctxParams.cParams.searchLog;
    auStack_128._20_4_ = cctxParams.cParams.minMatch;
    auStack_128._24_4_ = cctxParams.cParams.targetLength;
    auStack_128._0_4_ = cctxParams.format;
    auStack_128._4_4_ = cctxParams.cParams.windowLog;
    auStack_128._8_4_ = cctxParams.cParams.chainLog;
    auStack_128._12_4_ = cctxParams.cParams.hashLog;
    ZSTD_CCtxParams_init_internal
              (&cctxParams,(ZSTD_parameters *)auStack_128,*(int *)((long)&cctx[1].xxhState.v4 + 4));
    if (srcSizeHint != 0xffffffffffffffff) {
      uVar5 = 1;
      if (1 < srcSizeHint) {
        uVar6 = 0x80000;
        if (srcSizeHint < 0x80000) {
          uVar6 = srcSizeHint;
        }
        uVar4 = (int)uVar6 - 1;
        uVar5 = 0x1f;
        if (uVar4 != 0) {
          for (; uVar4 >> uVar5 == 0; uVar5 = uVar5 - 1) {
          }
        }
        uVar5 = (uVar5 ^ 0xffffffe0) + 0x21;
      }
      if (uVar5 < cctxParams.cParams.windowLog) {
        uVar5 = cctxParams.cParams.windowLog;
      }
      cctxParams.cParams.windowLog = uVar5;
    }
    sVar7 = ZSTD_compressBegin_internal
                      ((ZSTD_CCtx *)this,(void *)0x0,0,ZSTD_dct_auto,ZSTD_dtlm_fast,
                       (ZSTD_CDict *)cctx,&cctxParams,srcSizeHint,ZSTDb_not_buffered);
    return sVar7;
  }
  return 0xffffffffffffffe0;
}

Assistant:

static size_t ZSTD_compressBegin_usingCDict_internal(
    ZSTD_CCtx* const cctx, const ZSTD_CDict* const cdict,
    ZSTD_frameParameters const fParams, unsigned long long const pledgedSrcSize)
{
    ZSTD_CCtx_params cctxParams;
    DEBUGLOG(4, "ZSTD_compressBegin_usingCDict_internal");
    RETURN_ERROR_IF(cdict==NULL, dictionary_wrong, "NULL pointer!");
    /* Initialize the cctxParams from the cdict */
    {
        ZSTD_parameters params;
        params.fParams = fParams;
        params.cParams = ( pledgedSrcSize < ZSTD_USE_CDICT_PARAMS_SRCSIZE_CUTOFF
                        || pledgedSrcSize < cdict->dictContentSize * ZSTD_USE_CDICT_PARAMS_DICTSIZE_MULTIPLIER
                        || pledgedSrcSize == ZSTD_CONTENTSIZE_UNKNOWN
                        || cdict->compressionLevel == 0 ) ?
                ZSTD_getCParamsFromCDict(cdict)
              : ZSTD_getCParams(cdict->compressionLevel,
                                pledgedSrcSize,
                                cdict->dictContentSize);
        ZSTD_CCtxParams_init_internal(&cctxParams, &params, cdict->compressionLevel);
    }
    /* Increase window log to fit the entire dictionary and source if the
     * source size is known. Limit the increase to 19, which is the
     * window log for compression level 1 with the largest source size.
     */
    if (pledgedSrcSize != ZSTD_CONTENTSIZE_UNKNOWN) {
        U32 const limitedSrcSize = (U32)MIN(pledgedSrcSize, 1U << 19);
        U32 const limitedSrcLog = limitedSrcSize > 1 ? ZSTD_highbit32(limitedSrcSize - 1) + 1 : 1;
        cctxParams.cParams.windowLog = MAX(cctxParams.cParams.windowLog, limitedSrcLog);
    }
    return ZSTD_compressBegin_internal(cctx,
                                        NULL, 0, ZSTD_dct_auto, ZSTD_dtlm_fast,
                                        cdict,
                                        &cctxParams, pledgedSrcSize,
                                        ZSTDb_not_buffered);
}